

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O0

void __thiscall EthernetLink::onCollision(EthernetLink *this,Event *e)

{
  bool bVar1;
  reference ppEVar2;
  vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_> *in_RSI;
  long in_RDI;
  vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_> *unaff_retaddr;
  
  *(undefined1 *)(in_RDI + 0x61) = 0;
  *(undefined1 *)(in_RDI + 0x62) = 0;
  *(undefined1 *)(in_RDI + 0x60) = 0;
  while( true ) {
    bVar1 = std::vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>::empty
                      (unaff_retaddr);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppEVar2 = std::vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>::back(in_RSI);
    (*((*ppEVar2)->super_NetInterface).super_Entity._vptr_Entity[8])();
    std::vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>::pop_back
              ((vector<EthernetInterface_*,_std::allocator<EthernetInterface_*>_> *)0x13eabb);
  }
  *(undefined8 *)(in_RDI + 0x68) = 0;
  return;
}

Assistant:

void EthernetLink::onCollision(Event *e)
{
    DBGENTER(_ETHLINK_DBG);

    _isContending = false;
    _isCollision = false;
    _isBusy = false;
    while (!_contending.empty()) {
	_contending.back()->onCollision();
	_contending.pop_back();
    }
    _message = 0;        
}